

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::LocateIndexes
          (BamMultiReaderPrivate *this,IndexType *preferredType)

{
  string *psVar1;
  pointer pMVar2;
  BamReader *this_00;
  bool bVar3;
  MergeItem *item;
  pointer pMVar4;
  bool bVar5;
  allocator local_a1;
  BamMultiReaderPrivate *local_a0;
  IndexType *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string currentError;
  string message;
  
  psVar1 = &this->m_errorString;
  (this->m_errorString)._M_string_length = 0;
  *(this->m_errorString)._M_dataplus._M_p = '\0';
  pMVar2 = (this->m_readers).
           super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = false;
  local_a0 = this;
  local_98 = preferredType;
  for (pMVar4 = (this->m_readers).
                super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar4 != pMVar2; pMVar4 = pMVar4 + 1) {
    this_00 = pMVar4->Reader;
    if (this_00 != (BamReader *)0x0) {
      bVar3 = BamReader::HasIndex(this_00);
      if (!bVar3) {
        bVar3 = BamReader::LocateIndex(this_00,local_98);
        if (!bVar3) {
          std::__cxx11::string::append((ulong)psVar1,'\x01');
          BamReader::GetErrorString_abi_cxx11_(&currentError,this_00);
          std::__cxx11::string::append((string *)psVar1);
          std::__cxx11::string::~string((string *)&currentError);
          std::__cxx11::string::append((ulong)psVar1,'\x01');
          bVar5 = true;
        }
      }
    }
  }
  if (bVar5) {
    std::__cxx11::string::string((string *)&currentError,(string *)psVar1);
    std::__cxx11::string::string
              ((string *)&local_90,"error while locating index files: \n",&local_a1);
    std::operator+(&message,&local_90,&currentError);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_90,"BamMultiReader::LocatingIndexes",&local_a1);
    SetErrorString(local_a0,&local_90,&message);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&currentError);
  }
  return (bool)(~bVar5 & 1);
}

Assistant:

bool BamMultiReaderPrivate::LocateIndexes(const BamIndex::IndexType& preferredType)
{

    bool errorsEncountered = false;
    m_errorString.clear();

    // iterate over readers
    std::vector<MergeItem>::iterator readerIter = m_readers.begin();
    std::vector<MergeItem>::iterator readerEnd = m_readers.end();
    for (; readerIter != readerEnd; ++readerIter) {
        MergeItem& item = (*readerIter);
        BamReader* reader = item.Reader;
        if (reader == 0) {
            continue;
        }

        // if reader has no index, try to locate one
        if (!reader->HasIndex()) {
            if (!reader->LocateIndex(preferredType)) {
                m_errorString.append(1, '\t');
                m_errorString.append(reader->GetErrorString());
                m_errorString.append(1, '\n');
                errorsEncountered = true;
            }
        }
    }

    // check for errors encountered before returning success/fail
    if (errorsEncountered) {
        const std::string currentError = m_errorString;
        const std::string message =
            std::string("error while locating index files: \n") + currentError;
        SetErrorString("BamMultiReader::LocatingIndexes", message);
        return false;
    } else {
        return true;
    }
}